

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O1

void P_LoadGLZSegs(FileReaderBase *data,int type)

{
  line_t *plVar1;
  undefined8 *puVar2;
  uint uVar3;
  seg_t *psVar4;
  sector_t *psVar5;
  line_t *plVar6;
  vertex_t *pvVar7;
  ulong uVar8;
  long lVar9;
  vertex_t **ppvVar10;
  ulong uVar11;
  long lVar12;
  BYTE side;
  WORD lineword;
  DWORD line;
  DWORD partner;
  DWORD v1;
  byte local_47;
  ushort local_46;
  uint local_44;
  DWORD local_40;
  uint local_3c;
  long local_38;
  
  if (0 < numsubsectors) {
    lVar9 = 0;
    do {
      local_38 = lVar9;
      if (subsectors[lVar9].numlines != 0) {
        lVar12 = 0;
        uVar11 = 0;
        do {
          (*data->_vptr_FileReaderBase[2])(data,&local_3c,4);
          (*data->_vptr_FileReaderBase[2])(data,&local_40,4);
          if (type < 2) {
            (*data->_vptr_FileReaderBase[2])(data,&local_46,2);
            local_44 = (uint)local_46;
            if (local_44 == 0xffff) {
              local_44 = 0xffffffff;
            }
          }
          else {
            (*data->_vptr_FileReaderBase[2])(data,&local_44,4);
          }
          (*data->_vptr_FileReaderBase[2])(data,&local_47,1);
          psVar4 = subsectors[lVar9].firstline;
          pvVar7 = vertexes + local_3c;
          *(vertex_t **)((long)&psVar4->v1 + lVar12) = pvVar7;
          if (uVar11 == 0) {
            ppvVar10 = (vertex_t **)((long)&psVar4[subsectors[lVar9].numlines - 1].v2 + lVar12);
          }
          else {
            ppvVar10 = &psVar4[uVar11 - 1].v2;
          }
          *ppvVar10 = pvVar7;
          glsegextras[((ulong)((long)psVar4 + (lVar12 - (long)segs)) >> 3) * -0x1c71c71c71c71c7].
          PartnerSeg = local_40;
          plVar6 = lines;
          uVar8 = (ulong)local_44;
          if (uVar8 == 0xffffffff) {
            puVar2 = (undefined8 *)((long)&psVar4->sidedef + lVar12);
            *puVar2 = 0;
            puVar2[1] = 0;
            psVar5 = (subsectors[lVar9].firstline)->frontsector;
            *(sector_t **)((long)&psVar4->backsector + lVar12) = psVar5;
            *(sector_t **)((long)&psVar4->frontsector + lVar12) = psVar5;
          }
          else {
            plVar1 = lines + uVar8;
            *(line_t **)((long)&psVar4->linedef + lVar12) = plVar1;
            *(side_t **)((long)&psVar4->sidedef + lVar12) = plVar1->sidedef[local_47];
            *(sector_t **)((long)&psVar4->frontsector + lVar12) = plVar1->sidedef[local_47]->sector;
            uVar3 = plVar6[uVar8].flags;
            if (((uVar3 & 4) == 0) || (plVar1->sidedef[local_47 ^ 1] == (side_t *)0x0)) {
              *(undefined8 *)((long)&psVar4->backsector + lVar12) = 0;
              plVar1->flags = uVar3 & 0xfffffffb;
            }
            else {
              *(sector_t **)((long)&psVar4->backsector + lVar12) =
                   plVar1->sidedef[local_47 ^ 1]->sector;
            }
          }
          uVar11 = uVar11 + 1;
          lVar12 = lVar12 + 0x48;
        } while (uVar11 < subsectors[lVar9].numlines);
      }
      lVar9 = local_38 + 1;
    } while (lVar9 < numsubsectors);
  }
  return;
}

Assistant:

void P_LoadGLZSegs (FileReaderBase &data, int type)
{
	for (int i = 0; i < numsubsectors; ++i)
	{
		for (size_t j = 0; j < subsectors[i].numlines; ++j)
		{
			seg_t *seg;
			DWORD v1, partner;
			DWORD line;
			WORD lineword;
			BYTE side;

			data >> v1 >> partner;
			if (type >= 2)
			{
				data >> line;
			}
			else
			{
				data >> lineword;
				line = lineword == 0xFFFF ? 0xFFFFFFFF : lineword;
			}
			data >> side;

			seg = subsectors[i].firstline + j;
			seg->v1 = &vertexes[v1];
			if (j == 0)
			{
				seg[subsectors[i].numlines - 1].v2 = seg->v1;
			}
			else
			{
				seg[-1].v2 = seg->v1;
			}
			glsegextras[seg - segs].PartnerSeg = partner;
			if (line != 0xFFFFFFFF)
			{
				line_t *ldef;

				seg->linedef = ldef = &lines[line];
				seg->sidedef = ldef->sidedef[side];
				seg->frontsector = ldef->sidedef[side]->sector;
				if (ldef->flags & ML_TWOSIDED && ldef->sidedef[side^1] != NULL)
				{
					seg->backsector = ldef->sidedef[side^1]->sector;
				}
				else
				{
					seg->backsector = 0;
					ldef->flags &= ~ML_TWOSIDED;
				}
			}
			else
			{
				seg->linedef = NULL;
				seg->sidedef = NULL;
				seg->frontsector = seg->backsector = subsectors[i].firstline->frontsector;
			}
		}
	}
}